

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::StripProto_abi_cxx11_
          (string *__return_storage_ptr__,compiler *this,string_view filename)

{
  bool bVar1;
  char *pcVar2;
  string_view suffix;
  string_view suffix_00;
  string_view text;
  string_view str;
  size_t sStack_40;
  allocator<char> local_29;
  string_view local_28;
  
  suffix._M_str = ".protodevel";
  suffix._M_len = 0xb;
  text._M_str = (char *)filename._M_len;
  text._M_len = (size_t)this;
  bVar1 = absl::lts_20240722::EndsWith(text,suffix);
  if (bVar1) {
    pcVar2 = ".protodevel";
    sStack_40 = 0xb;
  }
  else {
    pcVar2 = ".proto";
    sStack_40 = 6;
  }
  suffix_00._M_str = pcVar2;
  suffix_00._M_len = sStack_40;
  str._M_str = (char *)filename._M_len;
  str._M_len = (size_t)this;
  local_28 = absl::lts_20240722::StripSuffix(str,suffix_00);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(absl::string_view filename) {
  if (absl::EndsWith(filename, ".protodevel")) {
    return std::string(absl::StripSuffix(filename, ".protodevel"));
  } else {
    return std::string(absl::StripSuffix(filename, ".proto"));
  }
}